

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall RPCHelpMan::ToString_abi_cxx11_(string *__return_storage_ptr__,RPCHelpMan *this)

{
  long lVar1;
  RPCArg *pRVar2;
  pointer pRVar3;
  bool bVar4;
  bool bVar5;
  const_reference this_00;
  ulong uVar6;
  RPCArg *arg;
  RPCArg *this_01;
  char *in_R9;
  pointer this_02;
  long in_FS_OFFSET;
  string_view pattern;
  string_view str;
  ulong local_150;
  ulong local_140;
  Section local_138;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Sections named_only_sections;
  Sections sections;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&this->m_name);
  pRVar2 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (this_01 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (this_01 != pRVar2 && ((this_01->m_opts).hidden == false)); this_01 = this_01 + 1) {
    bVar5 = RPCArg::IsOptional(this_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," ");
    if (bVar5) {
      bVar5 = !bVar4;
      bVar4 = true;
      if (bVar5) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,"( ");
      }
    }
    else {
      if (bVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,") ");
      }
      bVar4 = false;
    }
    RPCArg::ToString_abi_cxx11_(&local_138.m_left,this_01,true);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_138.m_left);
    std::__cxx11::string::~string((string *)&local_138);
  }
  if (bVar4) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," )");
  }
  pattern._M_str = in_R9;
  pattern._M_len = (size_t)" \f\n\r\t\v";
  str._M_str = (char *)0x6;
  str._M_len = (size_t)(this->m_description)._M_dataplus._M_p;
  util::TrimString_abi_cxx11_
            ((string *)&named_only_sections,(util *)(this->m_description)._M_string_length,str,
             pattern);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sections,
                 "\n\n",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &named_only_sections);
  std::operator+(&local_138.m_left,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sections,"\n"
                );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_138.m_left);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&sections);
  std::__cxx11::string::~string((string *)&named_only_sections);
  sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sections.m_max_pad = 0;
  sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  named_only_sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  named_only_sections.m_max_pad = 0;
  named_only_sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  named_only_sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150 = 0;
  while (local_150 <
         (ulong)(((long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x108)) {
    this_00 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at(&this->m_args,local_150);
    if ((this_00->m_opts).hidden != false) break;
    local_150 = local_150 + 1;
    local_140 = local_150;
    util::ToString<unsigned_long>(&local_b8,&local_140);
    std::operator+(&local_98,&local_b8,". ");
    RPCArg::GetFirstName_abi_cxx11_(&local_d8,this_00);
    std::operator+(&local_138.m_left,&local_98,&local_d8);
    RPCArg::ToDescriptionString_abi_cxx11_(&local_f8,this_00,true);
    std::vector<Section,std::allocator<Section>>::
    emplace_back<std::__cxx11::string,std::__cxx11::string>
              ((vector<Section,std::allocator<Section>> *)&sections,&local_138.m_left,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    uVar6 = sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].m_left._M_string_length;
    if (uVar6 < sections.m_max_pad) {
      uVar6 = sections.m_max_pad;
    }
    sections.m_max_pad = uVar6;
    Sections::Push(&sections,this_00,5,NONE);
    if (this_00->m_type == OBJ_NAMED_PARAMS) {
      pRVar3 = (this_00->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (this_00->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start; this_02 != pRVar3; this_02 = this_02 + 1) {
        RPCArg::GetFirstName_abi_cxx11_(&local_98,this_02);
        RPCArg::ToDescriptionString_abi_cxx11_(&local_b8,this_02,true);
        Section::Section(&local_138,&local_98,&local_b8);
        Sections::PushSection(&named_only_sections,&local_138);
        Section::~Section(&local_138);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        Sections::Push(&named_only_sections,this_02,5,NONE);
      }
    }
  }
  if (sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\nArguments:\n");
  }
  Sections::ToString_abi_cxx11_(&local_138.m_left,&sections);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_138.m_left);
  std::__cxx11::string::~string((string *)&local_138);
  if (named_only_sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_start !=
      named_only_sections.m_sections.super__Vector_base<Section,_std::allocator<Section>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\nNamed Arguments:\n");
  }
  Sections::ToString_abi_cxx11_(&local_138.m_left,&named_only_sections);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_138.m_left);
  std::__cxx11::string::~string((string *)&local_138);
  RPCResults::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_results);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_138.m_left);
  std::__cxx11::string::~string((string *)&local_138);
  RPCExamples::ToDescriptionString_abi_cxx11_(&local_138.m_left,&this->m_examples);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_138.m_left);
  std::__cxx11::string::~string((string *)&local_138);
  std::vector<Section,_std::allocator<Section>_>::~vector(&named_only_sections.m_sections);
  std::vector<Section,_std::allocator<Section>_>::~vector(&sections.m_sections);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string RPCHelpMan::ToString() const
{
    std::string ret;

    // Oneline summary
    ret += m_name;
    bool was_optional{false};
    for (const auto& arg : m_args) {
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden
        const bool optional = arg.IsOptional();
        ret += " ";
        if (optional) {
            if (!was_optional) ret += "( ";
            was_optional = true;
        } else {
            if (was_optional) ret += ") ";
            was_optional = false;
        }
        ret += arg.ToString(/*oneline=*/true);
    }
    if (was_optional) ret += " )";

    // Description
    ret += "\n\n" + TrimString(m_description) + "\n";

    // Arguments
    Sections sections;
    Sections named_only_sections;
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg = m_args.at(i);
        if (arg.m_opts.hidden) break; // Any arg that follows is also hidden

        // Push named argument name and description
        sections.m_sections.emplace_back(util::ToString(i + 1) + ". " + arg.GetFirstName(), arg.ToDescriptionString(/*is_named_arg=*/true));
        sections.m_max_pad = std::max(sections.m_max_pad, sections.m_sections.back().m_left.size());

        // Recursively push nested args
        sections.Push(arg);

        // Push named-only argument sections
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& arg_inner : arg.m_inner) {
                named_only_sections.PushSection({arg_inner.GetFirstName(), arg_inner.ToDescriptionString(/*is_named_arg=*/true)});
                named_only_sections.Push(arg_inner);
            }
        }
    }

    if (!sections.m_sections.empty()) ret += "\nArguments:\n";
    ret += sections.ToString();
    if (!named_only_sections.m_sections.empty()) ret += "\nNamed Arguments:\n";
    ret += named_only_sections.ToString();

    // Result
    ret += m_results.ToDescriptionString();

    // Examples
    ret += m_examples.ToDescriptionString();

    return ret;
}